

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan_state.cpp
# Opt level: O0

bool __thiscall
duckdb::CollectionScanState::ScanCommitted
          (CollectionScanState *this,DataChunk *result,SegmentLock *l,TableScanType type)

{
  idx_t iVar1;
  RowGroup *pRVar2;
  undefined1 in_CL;
  SegmentLock *in_RDX;
  SegmentTree<duckdb::RowGroup,_true> *in_RSI;
  long *in_RDI;
  CollectionScanState *in_stack_00000070;
  RowGroup *in_stack_00000078;
  TableScanType in_stack_000000af;
  DataChunk *in_stack_000000b0;
  CollectionScanState *in_stack_000000b8;
  RowGroup *in_stack_000000c0;
  undefined7 in_stack_ffffffffffffffd8;
  
  while( true ) {
    if (*in_RDI == 0) {
      return false;
    }
    RowGroup::ScanCommitted(in_stack_000000c0,in_stack_000000b8,in_stack_000000b0,in_stack_000000af)
    ;
    iVar1 = DataChunk::size((DataChunk *)in_RSI);
    if (iVar1 != 0) break;
    pRVar2 = SegmentTree<duckdb::RowGroup,_true>::GetNextSegment
                       (in_RSI,in_RDX,(RowGroup *)CONCAT17(in_CL,in_stack_ffffffffffffffd8));
    *in_RDI = (long)pRVar2;
    if (*in_RDI != 0) {
      RowGroup::InitializeScan(in_stack_00000078,in_stack_00000070);
    }
  }
  return true;
}

Assistant:

bool CollectionScanState::ScanCommitted(DataChunk &result, SegmentLock &l, TableScanType type) {
	while (row_group) {
		row_group->ScanCommitted(*this, result, type);
		if (result.size() > 0) {
			return true;
		} else {
			row_group = row_groups->GetNextSegment(l, row_group);
			if (row_group) {
				row_group->InitializeScan(*this);
			}
		}
	}
	return false;
}